

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.h
# Opt level: O0

void __thiscall CodeWriter::CodeWriter(CodeWriter *this)

{
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  CodeWriter *local_10;
  CodeWriter *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tab,"\t",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->newLine,"\n",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->comma,",",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->loadOp,"lw ",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->saveOp,"sw ",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->entry,"entry",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->halt,"hlt",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->nop,"nop",&local_2b);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->initStackPointer,"addi\tr14,r0,topaddr",&local_2c);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->tags);
  return;
}

Assistant:

CodeWriter() = default;